

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

Point * __thiscall tiger::trains::world::World::getPointOfPost(World *this,IPost *post)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  iVar1 = (*post->_vptr_IPost[4])(post);
  p_Var2 = (this->pointOfPost)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(this->pointOfPost)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = p_Var4;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (iVar1 <= (int)p_Var2[1]._M_color) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < iVar1];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((p_Var3 != p_Var4) && ((int)p_Var3[1]._M_color <= iVar1)) {
      p_Var4 = p_Var3;
    }
  }
  return (Point *)p_Var4[1]._M_parent;
}

Assistant:

Point *World::getPointOfPost(const IPost *post) const
{
    return pointOfPost.find(post->getIdx())->second;
}